

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamWriterPrivate::doWriteToDevice(QXmlStreamWriterPrivate *this,QStringView s)

{
  char *pcVar1;
  char *pcVar2;
  State *__n;
  storage_type_conflict *psVar3;
  char *out;
  State *in_R8;
  char *pcVar4;
  long in_FS_OFFSET;
  QStringView in;
  char buffer [1536];
  State local_668;
  QUtf8 local_638 [1536];
  long local_38;
  
  psVar3 = s.m_data;
  pcVar4 = (char *)s.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_638,0xaa,0x600);
  local_668.field_4.d[1] = (void *)0x0;
  local_668.clearFn = (ClearDataFn)0x0;
  local_668.invalidChars = 0;
  local_668.field_4.d[0] = (void *)0x0;
  local_668.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
  super_QFlagsStorage<QStringConverterBase::Flag>.i =
       (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
  local_668.internalState = 0;
  local_668.remainingChars = 0;
  if (pcVar4 != (char *)0x0) {
    do {
      out = (char *)0x200;
      if ((long)pcVar4 < 0x200) {
        out = pcVar4;
      }
      in.m_data = (storage_type_conflict *)&local_668;
      in.m_size = (qsizetype)psVar3;
      __n = &local_668;
      pcVar1 = QUtf8::convertFromUnicode(local_638,out,in,in_R8);
      pcVar2 = (char *)QIODevice::write(this->device,(int)local_638,pcVar1 + -(long)local_638,
                                        (size_t)__n);
      if (pcVar2 != pcVar1 + -(long)local_638) {
        this->field_0x78 = this->field_0x78 | 0x20;
      }
      psVar3 = psVar3 + (long)out;
      pcVar4 = pcVar4 + -(long)out;
    } while (pcVar4 != (char *)0x0);
    if (0 < local_668.remainingChars) {
      this->field_0x78 = this->field_0x78 | 0x40;
    }
  }
  QStringConverterBase::State::clear(&local_668);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::doWriteToDevice(QStringView s)
{
    constexpr qsizetype MaxChunkSize = 512;
    char buffer [3 * MaxChunkSize];
    QStringEncoder::State state;
    while (!s.isEmpty()) {
        const qsizetype chunkSize = std::min(s.size(), MaxChunkSize);
        char *end = QUtf8::convertFromUnicode(buffer, s.first(chunkSize), &state);
        doWriteToDevice(QUtf8StringView{buffer, end});
        s = s.sliced(chunkSize);
    }
    if (state.remainingChars > 0)
        hasEncodingError = true;
}